

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageFloat *image,char *name,int ds,long x,long y,long w,long h)

{
  float fVar1;
  undefined1 uVar2;
  bool bVar3;
  _Ios_Iostate __a;
  ulong uVar4;
  undefined8 uVar5;
  int *piVar6;
  long *plVar7;
  float *pfVar8;
  long lVar9;
  long lVar10;
  Image<float,_gimage::PixelTraits<float>_> *pIVar11;
  int in_ECX;
  char *in_RDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  fpos<__mbstate_t> fVar12;
  long in_stack_00000008;
  char *in_stack_00000010;
  ImageU8 imageu8;
  double offset;
  int subbit;
  long i_3;
  long k_2;
  exception *anon_var_0_1;
  exception *anon_var_0;
  size_t pos_1;
  Properties prop;
  string s;
  ImageU16 imageu16;
  failure *ex;
  int d_2;
  long i_2;
  long k_1;
  streambuf *sb_1;
  int d_1;
  long i_1;
  long j;
  int d;
  int ii;
  long i;
  long j_1;
  streambuf *sb;
  long kk;
  long k;
  valarray<int> nline;
  valarray<float> vline;
  ifstream in;
  bool msbfirst;
  char *c;
  float p;
  pos_type pos;
  int depth;
  float scale;
  long maxval;
  long height;
  long width;
  fpos<__mbstate_t> *in_stack_fffffffffffff808;
  int iVar13;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffff810;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff818;
  undefined1 *w_00;
  undefined4 in_stack_fffffffffffff820;
  store_t_conflict1 in_stack_fffffffffffff824;
  long in_stack_fffffffffffff828;
  work_t s_00;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffff830;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_fffffffffffff838;
  double s_01;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffff840;
  undefined7 in_stack_fffffffffffff848;
  undefined1 in_stack_fffffffffffff84f;
  IOException *in_stack_fffffffffffff850;
  long in_stack_fffffffffffff858;
  long in_stack_fffffffffffff860;
  long in_stack_fffffffffffff868;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffff870;
  allocator *key;
  Properties *this_00;
  undefined1 local_618 [56];
  double local_5e0;
  undefined4 in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  Properties *in_stack_fffffffffffffa30;
  double local_5c8;
  string local_5b8 [32];
  char *in_stack_fffffffffffffa68;
  double *in_stack_fffffffffffffa70;
  char *in_stack_fffffffffffffa78;
  Properties *in_stack_fffffffffffffa80;
  string local_570 [32];
  long local_550;
  string local_518 [32];
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [32];
  Properties local_4b0 [2];
  int local_444;
  long local_440;
  char *local_438;
  undefined8 local_430;
  undefined4 local_428;
  undefined4 uStack_424;
  int iStack_420;
  anon_union_4_2_91654ee9_for___value aStack_41c;
  int local_40c;
  long local_408 [3];
  long local_3f0 [3];
  int local_3d8;
  int local_3d4;
  long local_3d0 [3];
  long local_3b8 [3];
  undefined8 local_3a0;
  long local_398;
  fpos<__mbstate_t> local_390;
  fpos<__mbstate_t> local_380;
  long local_370;
  undefined4 local_368;
  undefined4 local_364;
  long local_360 [3];
  undefined4 local_344;
  valarray<int> local_340;
  undefined4 local_32c;
  valarray<float> local_328;
  long local_318 [31];
  long *in_stack_fffffffffffffde0;
  long *in_stack_fffffffffffffde8;
  float *in_stack_fffffffffffffdf0;
  long *in_stack_fffffffffffffdf8;
  int *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  int local_10c;
  pos_type local_108;
  undefined1 local_f5;
  allocator local_e1;
  string local_e0 [103];
  byte local_79;
  float *local_78;
  float local_6c;
  undefined8 local_68;
  __mbstate_t _Stack_60;
  int local_58;
  float local_54;
  long local_50;
  char *local_48;
  long local_40;
  long local_38;
  long local_30;
  int local_24;
  char *local_20;
  Image<float,_gimage::PixelTraits<float>_> *local_18;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)0x16a1e4);
  local_78 = &local_6c;
  local_79 = gutil::isMSBFirst();
  uVar4 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_20,1);
  if ((uVar4 & 1) == 0) {
    local_f5 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,local_20,&local_e1);
    std::operator+((char *)in_stack_fffffffffffff818,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff810);
    std::operator+(in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810);
    gutil::IOException::IOException
              (in_stack_fffffffffffff850,
               (string *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    local_f5 = 0;
    __cxa_throw(uVar5,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_108 = anon_unknown_11::readPNMHeader
                        (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  local_68 = local_108._M_off;
  _Stack_60 = local_108._M_state;
  if ((local_54 != 0.0) || (NAN(local_54))) {
    local_10c = 1;
    piVar6 = std::max<int>(&local_10c,&local_24);
    local_24 = *piVar6;
    if (in_stack_00000008 < 0) {
      in_stack_00000008 = (local_40 + local_24 + -1) / (long)local_24;
    }
    if ((long)in_stack_00000010 < 0) {
      in_stack_00000010 = (char *)((long)(local_48 + (long)local_24 + -1) / (long)local_24);
    }
    Image<float,_gimage::PixelTraits<float>_>::setSize
              (in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860,
               in_stack_fffffffffffff858);
    Image<float,_gimage::PixelTraits<float>_>::clear(in_stack_fffffffffffff830);
    std::ifstream::ifstream(local_318);
    uVar5 = *(undefined8 *)(local_318[0] + -0x18);
    __a = std::operator|(_S_failbit,_S_badbit);
    std::operator|(__a,_S_eofbit);
    std::ios::exceptions((int)local_318 + (int)uVar5);
    std::ifstream::open((char *)local_318,(_Ios_Openmode)local_20);
    if ((((local_24 < 2) && (local_30 == 0)) && (local_38 == 0)) &&
       ((in_stack_00000008 == local_40 && (in_stack_00000010 == local_48)))) {
      local_428 = (undefined4)local_68;
      uStack_424 = local_68._4_4_;
      iStack_420 = _Stack_60.__count;
      aStack_41c.__wch = _Stack_60.__value.__wch;
      std::istream::seekg(local_318,local_68,_Stack_60);
      local_430 = std::ifstream::rdbuf();
      while( true ) {
        local_438 = local_48 + -1;
        if ((long)local_438 < 0) break;
        for (local_440 = 0; local_48 = local_438, local_440 < local_40; local_440 = local_440 + 1) {
          for (local_444 = 0; local_444 < local_58; local_444 = local_444 + 1) {
            if (((0.0 < local_54) && ((local_79 & 1) != 0)) ||
               ((local_54 < 0.0 && ((local_79 & 1) == 0)))) {
              uVar2 = std::streambuf::sbumpc();
              *(undefined1 *)local_78 = uVar2;
              uVar2 = std::streambuf::sbumpc();
              *(undefined1 *)((long)local_78 + 1) = uVar2;
              uVar2 = std::streambuf::sbumpc();
              *(undefined1 *)((long)local_78 + 2) = uVar2;
              uVar2 = std::streambuf::sbumpc();
              *(undefined1 *)((long)local_78 + 3) = uVar2;
            }
            else {
              uVar2 = std::streambuf::sbumpc();
              *(undefined1 *)((long)local_78 + 3) = uVar2;
              uVar2 = std::streambuf::sbumpc();
              *(undefined1 *)((long)local_78 + 2) = uVar2;
              uVar2 = std::streambuf::sbumpc();
              *(undefined1 *)((long)local_78 + 1) = uVar2;
              uVar2 = std::streambuf::sbumpc();
              *(undefined1 *)local_78 = uVar2;
            }
            Image<float,_gimage::PixelTraits<float>_>::set
                      (local_18,local_440,(long)local_438,local_444,local_6c);
          }
        }
      }
    }
    else {
      local_32c = 0;
      std::valarray<float>::valarray
                ((valarray<float> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                 (float *)in_stack_fffffffffffff818,(size_t)in_stack_fffffffffffff810);
      local_344 = 0;
      std::valarray<int>::valarray
                ((valarray<int> *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                 (int *)in_stack_fffffffffffff818,(size_t)in_stack_fffffffffffff810);
      local_360[1] = 0;
      local_360[0] = -local_38;
      plVar7 = std::max<long>(local_360 + 1,local_360);
      for (local_360[2] = *plVar7;
          local_360[2] < (long)in_stack_00000010 &&
          (local_38 + local_360[2]) * (long)local_24 < (long)local_48;
          local_360[2] = local_360[2] + 1) {
        local_364 = 0;
        std::valarray<float>::operator=
                  ((valarray<float> *)in_stack_fffffffffffff810,(float *)in_stack_fffffffffffff808);
        local_368 = 0;
        std::valarray<int>::operator=
                  ((valarray<int> *)in_stack_fffffffffffff810,(int *)in_stack_fffffffffffff808);
        local_370 = 0;
        while( true ) {
          bVar3 = false;
          if (local_370 < local_24) {
            bVar3 = local_370 + (local_38 + local_360[2]) * (long)local_24 < (long)local_48;
          }
          if (!bVar3) break;
          fVar12 = std::fpos<__mbstate_t>::operator+(in_stack_fffffffffffff808,0x16a7f1);
          local_398 = 0;
          local_390 = fVar12;
          std::max<long>(&local_398,&local_30);
          fVar12 = std::fpos<__mbstate_t>::operator+(in_stack_fffffffffffff808,0x16a882);
          local_380 = fVar12;
          std::istream::seekg(local_318,fVar12._M_off,fVar12._M_state);
          local_3a0 = std::ifstream::rdbuf();
          local_3b8[1] = 0;
          local_3b8[0] = -local_30;
          plVar7 = std::max<long>(local_3b8 + 1,local_3b8);
          local_3b8[2] = *plVar7 * (long)local_58;
          local_3d0[1] = 0;
          local_3d0[0] = -local_30;
          plVar7 = std::max<long>(local_3d0 + 1,local_3d0);
          for (local_3d0[2] = *plVar7;
              local_3d0[2] < in_stack_00000008 &&
              (local_30 + local_3d0[2]) * (long)local_24 < local_40; local_3d0[2] = local_3d0[2] + 1
              ) {
            local_3d4 = 0;
            while( true ) {
              bVar3 = false;
              if (local_3d4 < local_24) {
                bVar3 = (local_30 + local_3d0[2]) * (long)local_24 + (long)local_3d4 < local_40;
              }
              if (!bVar3) break;
              for (local_3d8 = 0; local_3d8 < local_58; local_3d8 = local_3d8 + 1) {
                if (((0.0 < local_54) && ((local_79 & 1) != 0)) ||
                   ((local_54 < 0.0 && ((local_79 & 1) == 0)))) {
                  uVar2 = std::streambuf::sbumpc();
                  *(undefined1 *)local_78 = uVar2;
                  uVar2 = std::streambuf::sbumpc();
                  *(undefined1 *)((long)local_78 + 1) = uVar2;
                  uVar2 = std::streambuf::sbumpc();
                  *(undefined1 *)((long)local_78 + 2) = uVar2;
                  uVar2 = std::streambuf::sbumpc();
                  *(undefined1 *)((long)local_78 + 3) = uVar2;
                }
                else {
                  uVar2 = std::streambuf::sbumpc();
                  *(undefined1 *)((long)local_78 + 3) = uVar2;
                  uVar2 = std::streambuf::sbumpc();
                  *(undefined1 *)((long)local_78 + 2) = uVar2;
                  uVar2 = std::streambuf::sbumpc();
                  *(undefined1 *)((long)local_78 + 1) = uVar2;
                  uVar2 = std::streambuf::sbumpc();
                  *(undefined1 *)local_78 = uVar2;
                }
                bVar3 = Image<float,_gimage::PixelTraits<float>_>::isValidS
                                  (in_stack_fffffffffffff810,
                                   (store_t_conflict1)((ulong)in_stack_fffffffffffff808 >> 0x20));
                fVar1 = local_6c;
                if (bVar3) {
                  pfVar8 = std::valarray<float>::operator[](&local_328,local_3b8[2] + local_3d8);
                  *pfVar8 = *pfVar8 + fVar1;
                  piVar6 = std::valarray<int>::operator[](&local_340,local_3b8[2] + local_3d8);
                  *piVar6 = *piVar6 + 1;
                }
              }
              local_3d4 = local_3d4 + 1;
            }
            local_3b8[2] = local_58 + local_3b8[2];
          }
          local_370 = local_370 + 1;
        }
        local_3f0[1] = 0;
        local_3f0[0] = -local_30;
        plVar7 = std::max<long>(local_3f0 + 1,local_3f0);
        local_3f0[2] = *plVar7 * (long)local_58;
        local_408[1] = 0;
        local_408[0] = -local_30;
        plVar7 = std::max<long>(local_408 + 1,local_408);
        for (local_408[2] = *plVar7;
            local_408[2] < in_stack_00000008 &&
            (local_30 + local_408[2]) * (long)local_24 < local_40; local_408[2] = local_408[2] + 1)
        {
          for (local_40c = 0; local_40c < local_58; local_40c = local_40c + 1) {
            piVar6 = std::valarray<int>::operator[](&local_340,local_3f0[2]);
            pIVar11 = local_18;
            lVar10 = local_360[2];
            lVar9 = local_408[2];
            iVar13 = local_40c;
            if (0 < *piVar6) {
              pfVar8 = std::valarray<float>::operator[](&local_328,local_3f0[2]);
              fVar1 = *pfVar8;
              piVar6 = std::valarray<int>::operator[](&local_340,local_3f0[2]);
              Image<float,_gimage::PixelTraits<float>_>::set
                        (pIVar11,lVar9,lVar10,iVar13,fVar1 / (float)*piVar6);
            }
            local_3f0[2] = local_3f0[2] + 1;
          }
        }
      }
      std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffff810);
      std::valarray<float>::~valarray((valarray<float> *)in_stack_fffffffffffff810);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_318);
  }
  else {
    iVar13 = (int)((ulong)in_stack_fffffffffffff808 >> 0x20);
    if (local_50 < 0x100) {
      w_00 = local_618;
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),(long)w_00,
                 (long)in_stack_fffffffffffff810,iVar13);
      (**(code **)(*in_RDI + 0x30))
                (in_RDI,w_00,local_20,local_24,local_30,local_38,in_stack_00000008,in_stack_00000010
                );
      Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_char>
                (in_stack_fffffffffffff840,
                 (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffff838);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    }
    else {
      this_00 = local_4b0;
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::Image
                ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                 CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                 (long)in_stack_fffffffffffff818,(long)in_stack_fffffffffffff810,iVar13);
      (**(code **)(*in_RDI + 0x38))(in_RDI,this_00,local_20,local_24,local_30,local_38);
      Image<float,_gimage::PixelTraits<float>_>::setImageLimited<unsigned_short>
                (in_stack_fffffffffffff840,in_stack_fffffffffffff838);
      key = &local_4d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d0,local_20,key);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      lVar9 = std::__cxx11::string::rfind((char *)local_4d0,0x1af838);
      lVar10 = std::__cxx11::string::size();
      if (lVar9 == lVar10 + -9) {
        std::__cxx11::string::rfind((char *)local_4d0,0x1af838);
        std::__cxx11::string::substr((ulong)local_4f8,(ulong)local_4d0);
        std::__cxx11::string::operator=(local_4d0,local_4f8);
        std::__cxx11::string::~string(local_4f8);
        __rhs = in_stack_00000010;
      }
      else {
        lVar9 = std::__cxx11::string::rfind((char *)local_4d0,0x1af842);
        lVar10 = std::__cxx11::string::size();
        if (lVar9 == lVar10 + -0xb) {
          std::__cxx11::string::rfind((char *)local_4d0,0x1af842);
          std::__cxx11::string::substr((ulong)local_518,(ulong)local_4d0);
          std::__cxx11::string::operator=(local_4d0,local_518);
          std::__cxx11::string::~string(local_518);
          __rhs = in_stack_00000010;
        }
        else {
          std::__cxx11::string::operator=(local_4d0,"");
          __rhs = in_stack_00000010;
        }
      }
      lVar9 = std::__cxx11::string::size();
      if (lVar9 != 0) {
        gutil::Properties::Properties((Properties *)0x16b778);
        local_550 = std::__cxx11::string::rfind((char)local_4d0,0x5f);
        if (local_550 != -1) {
          local_550 = std::__cxx11::string::rfind((char)local_4d0,0x5f);
        }
        if (local_550 != -1) {
          std::__cxx11::string::substr((ulong)&stack0xfffffffffffffa70,(ulong)local_4d0);
          std::operator+(in_stack_fffffffffffff818,__rhs);
          std::__cxx11::string::c_str();
          gutil::Properties::load
                    (in_stack_fffffffffffffa30,
                     (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
          std::__cxx11::string::~string(local_570);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffa70);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff838,(char *)in_stack_fffffffffffff830);
        std::__cxx11::string::c_str();
        gutil::Properties::load
                  (in_stack_fffffffffffffa30,
                   (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        std::__cxx11::string::~string(local_5b8);
        bVar3 = gutil::Properties::contains(this_00,(char *)key);
        s_00 = (work_t)((ulong)in_stack_fffffffffffff828 >> 0x20);
        if (bVar3) {
          local_5c8 = 0.0;
          while( true ) {
            s_00 = (work_t)((ulong)in_stack_fffffffffffff828 >> 0x20);
            s_01 = local_5c8;
            pIVar11 = (Image<float,_gimage::PixelTraits<float>_> *)
                      Image<float,_gimage::PixelTraits<float>_>::getHeight(local_18);
            if ((long)pIVar11 <= (long)s_01) break;
            in_stack_fffffffffffff828 = 0;
            while (lVar9 = in_stack_fffffffffffff828,
                  in_stack_fffffffffffff830 =
                       (Image<float,_gimage::PixelTraits<float>_> *)
                       Image<float,_gimage::PixelTraits<float>_>::getWidth(local_18),
                  in_stack_fffffffffffff828 < (long)in_stack_fffffffffffff830) {
              in_stack_fffffffffffff824 =
                   Image<float,_gimage::PixelTraits<float>_>::get(local_18,lVar9,(long)local_5c8,0);
              if (32767.0 < in_stack_fffffffffffff824) {
                Image<float,_gimage::PixelTraits<float>_>::setInvalid
                          ((Image<float,_gimage::PixelTraits<float>_> *)
                           CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),
                           (long)in_stack_fffffffffffff818,(long)__rhs,in_stack_00000008);
              }
              in_stack_fffffffffffff828 = lVar9 + 1;
            }
            local_5c8 = (double)((long)local_5c8 + 1);
          }
          gutil::Properties::getValue<int>
                    (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                     (int *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
          if (0 < in_stack_fffffffffffffa2c) {
            operator/=(pIVar11,s_01);
          }
        }
        bVar3 = gutil::Properties::contains(this_00,(char *)key);
        in_stack_fffffffffffff820 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff820);
        if (bVar3) {
          gutil::Properties::getValue<double>
                    (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                     in_stack_fffffffffffffa68);
          if ((local_5e0 != 0.0) || (NAN(local_5e0))) {
            operator+=(in_stack_fffffffffffff830,s_00);
          }
        }
        gutil::Properties::~Properties((Properties *)0x16bbcb);
      }
      std::__cxx11::string::~string(local_4d0);
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image
                ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)
                 CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820));
    }
  }
  return;
}

Assistant:

void PNMImageIO::load(ImageFloat &image, const char *name, int ds, long x,
                      long y, long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;
  float p;
  char *c=reinterpret_cast<char *>(&p);
  bool msbfirst=gutil::isMSBFirst();

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, depth);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(name, std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<float> vline(0.0f, w*depth);
        std::valarray<int> nline(0, w*depth);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(pos+static_cast<std::streamoff>(height-1-(y+k)*ds-kk)*width*depth*4+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*depth*4);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x)*depth;

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                for (int d=0; d<depth; d++)
                {
                  // we assume that the plattform uses IEEE 32 bit floating
                  // point format, otherwise this will not work

                  if ((scale > 0 && msbfirst) || (scale < 0 && !msbfirst))
                  {
                    c[0]=sb->sbumpc();
                    c[1]=sb->sbumpc();
                    c[2]=sb->sbumpc();
                    c[3]=sb->sbumpc();
                  }
                  else
                  {
                    c[3]=sb->sbumpc();
                    c[2]=sb->sbumpc();
                    c[1]=sb->sbumpc();
                    c[0]=sb->sbumpc();
                  }

                  if (image.isValidS(p))
                  {
                    vline[j+d]+=p;
                    nline[j+d]++;
                  }
                }
              }

              j+=depth;
            }
          }

          // store line into image

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              if (nline[j] > 0)
              {
                image.set(i, k, d, vline[j]/nline[j]);
              }

              j++;
            }
          }
        }
      }
      else // load whole image
      {
        in.seekg(pos);
        std::streambuf *sb=in.rdbuf();

        for (long k=height-1; k>=0; k--)
        {
          for (long i=0; i<width; i++)
          {
            for (int d=0; d<depth; d++)
            {
              // we assume that the plattform uses IEEE 32 bit floating
              // point format, otherwise this will not work

              if ((scale > 0 && msbfirst) || (scale < 0 && !msbfirst))
              {
                c[0]=sb->sbumpc();
                c[1]=sb->sbumpc();
                c[2]=sb->sbumpc();
                c[3]=sb->sbumpc();
              }
              else
              {
                c[3]=sb->sbumpc();
                c[2]=sb->sbumpc();
                c[1]=sb->sbumpc();
                c[0]=sb->sbumpc();
              }

              image.set(i, k, d, p);
            }
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else if (maxval > 255)
  {
    ImageU16 imageu16;
    load(imageu16, name, ds, x, y, w, h);
    image.setImageLimited(imageu16);

    // support for reading legacy disparity images in fixed point format

    std::string s=name;

    if (s.rfind("_disp.pgm") == s.size()-9)
    {
      s=s.substr(0, s.rfind("_disp.pgm"));
    }
    else if (s.rfind("_height.pgm") == s.size()-11)
    {
      s=s.substr(0, s.rfind("_height.pgm"));
    }
    else
    {
      s="";
    }

    if (s.size() > 0)
    {
      gutil::Properties prop;

      try
      {
        size_t pos=s.rfind('_');

        if (pos != s.npos)
        {
          pos=s.rfind('_', pos-1);
        }

        if (pos != s.npos)
        {
          prop.load((s.substr(0, pos)+"_param.txt").c_str());
        }
      }
      catch (const std::exception &)
      { }

      try
      {
        prop.load((s+"_param.txt").c_str());
      }
      catch (const std::exception &)
      { }

      if (prop.contains("subbit"))
      {
        // invalid disparities in legacy disparity images have a value > 32767

        for (long k=0; k<image.getHeight(); k++)
        {
          for (long i=0; i<image.getWidth(); i++)
          {
            if (image.get(i, k) > 32767)
            {
              image.setInvalid(i, k, 0);
            }
          }
        }

        // consider sub-pixel setting

        int subbit;
        prop.getValue("subbit", subbit);

        if (subbit > 0)
        {
          image/=1<<subbit;
        }
      }

      // consider offset

      if (prop.contains("origin.d"))
      {
        double offset;
        prop.getValue("origin.d", offset);

        if (offset != 0)
        {
          image+=static_cast<float>(offset);
        }
      }
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}